

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

size_t __thiscall wasm::WATParser::anon_unknown_10::LexCtx::startsWith(LexCtx *this,string_view sv)

{
  int iVar1;
  size_t sVar2;
  size_type __rlen;
  ulong __n;
  string_view sVar3;
  
  __n = sv._M_len;
  sVar3 = next(this);
  if ((sVar3._M_len < __n) || ((__n != 0 && (iVar1 = bcmp(sVar3._M_str,sv._M_str,__n), iVar1 != 0)))
     ) {
    sVar2 = 0;
  }
  else {
    sVar2 = 1;
  }
  return sVar2;
}

Assistant:

size_t startsWith(std::string_view sv) const {
    return next().substr(0, sv.size()) == sv;
  }